

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

TZDBNames * icu_63::TZDBTimeZoneNames::getMetaZoneNames(UnicodeString *mzID,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UResourceBundle *pUVar3;
  UChar *key_00;
  void *newKey;
  char key [129];
  UResourceBundle *zoneStringsRes;
  void *cacheVal;
  Char16Ptr local_140;
  char16_t local_138 [4];
  UChar mzIDKey [129];
  UResourceBundle *local_28;
  TZDBNames *tzdbNames;
  UErrorCode *status_local;
  UnicodeString *mzID_local;
  
  umtx_initOnce((UInitOnce *)&gTZDBNamesMapInitOnce,initTZDBNamesMap,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    local_28 = (UResourceBundle *)0x0;
    Char16Ptr::Char16Ptr(&local_140,local_138);
    icu_63::UnicodeString::extract(mzID,&local_140,0x81,status);
    Char16Ptr::~Char16Ptr(&local_140);
    iVar2 = icu_63::UnicodeString::length(mzID);
    mzIDKey[(long)iVar2 + -4] = L'\0';
    umtx_lock_63((UMutex *)gTZDBNamesMapLock);
    pUVar3 = (UResourceBundle *)uhash_get_63(gTZDBNamesMap,local_138);
    if (pUVar3 == (UResourceBundle *)0x0) {
      register0x00000000 = ures_openDirect_63("icudt63l-zone","tzdbNames",status);
      register0x00000000 =
           ures_getByKey_63(register0x00000000,"zoneStrings",register0x00000000,status);
      UVar1 = ::U_SUCCESS(*status);
      if (UVar1 != '\0') {
        mergeTimeZoneKey(mzID,(char *)&newKey);
        local_28 = (UResourceBundle *)
                   TZDBNames::createInstance(stack0xfffffffffffffea0,(char *)&newKey);
        zoneStringsRes = local_28;
        if (local_28 == (UResourceBundle *)0x0) {
          zoneStringsRes = (UResourceBundle *)EMPTY;
        }
        key_00 = ZoneMeta::findMetaZoneID(mzID);
        if (key_00 == (UChar *)0x0) {
          if (local_28 != (UResourceBundle *)0x0) {
            if (local_28 != (UResourceBundle *)0x0) {
              (**(_func_int **)((long)local_28->fKey + 8))();
            }
            local_28 = (UResourceBundle *)0x0;
          }
        }
        else {
          uhash_put_63(gTZDBNamesMap,key_00,zoneStringsRes,status);
          UVar1 = ::U_FAILURE(*status);
          if ((UVar1 != '\0') && (local_28 != (UResourceBundle *)0x0)) {
            if (local_28 != (UResourceBundle *)0x0) {
              (**(_func_int **)((long)local_28->fKey + 8))();
            }
            local_28 = (UResourceBundle *)0x0;
          }
        }
      }
      ures_close_63(stack0xfffffffffffffea0);
    }
    else if (pUVar3 != (UResourceBundle *)"<empty>") {
      local_28 = pUVar3;
    }
    umtx_unlock_63((UMutex *)gTZDBNamesMapLock);
    mzID_local = (UnicodeString *)local_28;
  }
  else {
    mzID_local = (UnicodeString *)0x0;
  }
  return (TZDBNames *)mzID_local;
}

Assistant:

const TZDBNames*
TZDBTimeZoneNames::getMetaZoneNames(const UnicodeString& mzID, UErrorCode& status) {
    umtx_initOnce(gTZDBNamesMapInitOnce, &initTZDBNamesMap, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    TZDBNames* tzdbNames = NULL;

    UChar mzIDKey[ZID_KEY_MAX + 1];
    mzID.extract(mzIDKey, ZID_KEY_MAX + 1, status);
    U_ASSERT(status == U_ZERO_ERROR);   // already checked length above
    mzIDKey[mzID.length()] = 0;

    umtx_lock(&gTZDBNamesMapLock);
    {
        void *cacheVal = uhash_get(gTZDBNamesMap, mzIDKey);
        if (cacheVal == NULL) {
            UResourceBundle *zoneStringsRes = ures_openDirect(U_ICUDATA_ZONE, "tzdbNames", &status);
            zoneStringsRes = ures_getByKey(zoneStringsRes, gZoneStrings, zoneStringsRes, &status);
            if (U_SUCCESS(status)) {
                char key[ZID_KEY_MAX + 1];
                mergeTimeZoneKey(mzID, key);
                tzdbNames = TZDBNames::createInstance(zoneStringsRes, key);

                if (tzdbNames == NULL) {
                    cacheVal = (void *)EMPTY;
                } else {
                    cacheVal = tzdbNames;
                }
                // Use the persistent ID as the resource key, so we can
                // avoid duplications.
                // TODO: Is there a more efficient way, like intern() in Java?
                void* newKey = (void*) ZoneMeta::findMetaZoneID(mzID);
                if (newKey != NULL) {
                    uhash_put(gTZDBNamesMap, newKey, cacheVal, &status);
                    if (U_FAILURE(status)) {
                        if (tzdbNames != NULL) {
                            delete tzdbNames;
                            tzdbNames = NULL;
                        }
                    }
                } else {
                    // Should never happen with a valid input
                    if (tzdbNames != NULL) {
                        // It's not possible that we get a valid tzdbNames with unknown ID.
                        // But just in case..
                        delete tzdbNames;
                        tzdbNames = NULL;
                    }
                }
            }
            ures_close(zoneStringsRes);
        } else if (cacheVal != EMPTY) {
            tzdbNames = (TZDBNames *)cacheVal;
        }
    }
    umtx_unlock(&gTZDBNamesMapLock);

    return tzdbNames;
}